

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argh.h
# Opt level: O0

string_stream * __thiscall
argh::parser::operator()(string_stream *__return_storage_ptr__,parser *this,size_t ind,int *def_val)

{
  size_type sVar1;
  const_reference value;
  string local_1d0 [48];
  long local_1a0;
  ostringstream ostr;
  int *def_val_local;
  size_t ind_local;
  parser *this_local;
  
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->pos_args_);
  if (ind < sVar1) {
    value = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&this->pos_args_,ind);
    stringstream_proxy::stringstream_proxy(__return_storage_ptr__,value);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
    std::ios_base::precision((ios_base *)((long)&local_1a0 + *(long *)(local_1a0 + -0x18)),0x15);
    std::ostream::operator<<(&local_1a0,*def_val);
    std::__cxx11::ostringstream::str();
    stringstream_proxy::stringstream_proxy(__return_storage_ptr__,local_1d0);
    std::__cxx11::string::~string((string *)local_1d0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  }
  return __return_storage_ptr__;
}

Assistant:

string_stream parser::operator()(size_t ind, T&& def_val) const
   {
      if (pos_args_.size() <= ind)
      {
         std::ostringstream ostr;
         ostr.precision(std::numeric_limits<long double>::max_digits10);
         ostr << def_val;
         return string_stream(ostr.str());
      }

      return string_stream(pos_args_[ind]);
   }